

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_getdate.c
# Opt level: O1

time_t DSTcorrect(time_t Start,time_t Future)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  tm *ptVar5;
  long in_RSI;
  long in_RDI;
  tm tmbuf;
  long local_68;
  long local_60;
  tm local_58;
  
  local_68 = in_RSI;
  local_60 = in_RDI;
  ptVar5 = localtime_r(&local_60,&local_58);
  iVar2 = ptVar5->tm_hour;
  iVar1 = iVar2 + 1;
  iVar3 = iVar1 >> 0x1f;
  ptVar5 = localtime_r(&local_68,&local_58);
  iVar4 = ptVar5->tm_hour + 1;
  return (long)(int)((((((uint)(iVar4 / 6 + (iVar4 >> 0x1f)) >> 2) - (iVar4 >> 0x1f)) * 0x18 - iVar4
                      ) + iVar2 + (((uint)(iVar1 / 6 + iVar3) >> 2) - iVar3) * -0x18 + 1) * 0xe10) +
         (local_68 - local_60);
}

Assistant:

static time_t
DSTcorrect(time_t Start, time_t Future)
{
	time_t		StartDay;
	time_t		FutureDay;
	struct tm	*ltime;
#if defined(HAVE_LOCALTIME_R) || defined(HAVE_LOCALTIME_S)
	struct tm	tmbuf;
#endif
#if defined(HAVE_LOCALTIME_S)
	ltime = localtime_s(&tmbuf, &Start) ? NULL : &tmbuf;
#elif defined(HAVE_LOCALTIME_R)
	ltime = localtime_r(&Start, &tmbuf);
#else
	ltime = localtime(&Start);
#endif
	StartDay = (ltime->tm_hour + 1) % 24;
#if defined(HAVE_LOCALTIME_S)
	ltime = localtime_s(&tmbuf, &Future) ? NULL : &tmbuf;
#elif defined(HAVE_LOCALTIME_R)
	ltime = localtime_r(&Future, &tmbuf);
#else
	ltime = localtime(&Future);
#endif
	FutureDay = (ltime->tm_hour + 1) % 24;
	return (Future - Start) + (StartDay - FutureDay) * HOUR;
}